

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void __thiscall
kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37],kj::StringPtr_const&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          char (*params) [37],StringPtr *params_1)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  ArrayPtr<const_char> *params_00;
  ArrayPtr<const_char> *params_01;
  long lVar4;
  String argValues [2];
  String *__return_storage_ptr__;
  undefined8 uVar5;
  String local_78;
  String local_60;
  char (*local_40) [37];
  size_t local_38;
  
  this->exception = (Exception *)0x0;
  local_38 = strlen(*params);
  local_40 = params;
  __return_storage_ptr__ = &local_78;
  concat<kj::ArrayPtr<char_const>>(__return_storage_ptr__,(_ *)&local_40,params_00);
  local_40 = (char (*) [37])(params_1->content).ptr;
  local_38 = (params_1->content).size_ - 1;
  concat<kj::ArrayPtr<char_const>>(&local_60,(_ *)&local_40,params_01);
  uVar5 = 2;
  init(this,(EVP_PKEY_CTX *)file);
  lVar4 = 0x18;
  do {
    lVar1 = *(long *)((long)&local_78.content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_78.content.size_ + lVar4);
      *(undefined8 *)((long)&local_78.content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_78.content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_78.content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0,__return_storage_ptr__,uVar5);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}